

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t gnu_sparse_old_read(archive_read *a,tar *tar,archive_entry_header_gnutar *header,
                           size_t *unconsumed)

{
  wchar_t wVar1;
  gnu_sparse *sparse;
  extended *ext;
  void *data;
  ssize_t bytes_read;
  size_t *unconsumed_local;
  archive_entry_header_gnutar *header_local;
  tar *tar_local;
  archive_read *a_local;
  
  bytes_read = (ssize_t)unconsumed;
  unconsumed_local = (size_t *)header;
  header_local = (archive_entry_header_gnutar *)tar;
  tar_local = (tar *)a;
  wVar1 = gnu_sparse_old_parse(a,tar,header->sparse,L'\x04');
  if (wVar1 == L'\0') {
    if (*(char *)((long)unconsumed_local + 0x1e2) == '\0') {
      a_local._4_4_ = L'\0';
    }
    else {
      do {
        tar_flush_unconsumed((archive_read *)tar_local,(size_t *)bytes_read);
        sparse = (gnu_sparse *)
                 __archive_read_ahead((archive_read *)tar_local,0x200,(ssize_t *)&data);
        if ((long)data < 0) {
          return L'\xffffffe2';
        }
        if ((long)data < 0x200) {
          archive_set_error((archive *)tar_local,0x54,
                            "Truncated tar archive detected while reading sparse file data");
          return L'\xffffffe2';
        }
        *(undefined8 *)bytes_read = 0x200;
        wVar1 = gnu_sparse_old_parse((archive_read *)tar_local,(tar *)header_local,sparse,L'\x15');
        if (wVar1 != L'\0') {
          return L'\xffffffe2';
        }
      } while (sparse[0x15].offset[0] != '\0');
      if (*(long *)(header_local->gname + 0x17) != 0) {
        *(undefined8 *)(header_local->uname + 0xf) =
             *(undefined8 *)(*(long *)(header_local->gname + 0x17) + 8);
      }
      a_local._4_4_ = L'\0';
    }
  }
  else {
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int
gnu_sparse_old_read(struct archive_read *a, struct tar *tar,
    const struct archive_entry_header_gnutar *header, size_t *unconsumed)
{
	ssize_t bytes_read;
	const void *data;
	struct extended {
		struct gnu_sparse sparse[21];
		char	isextended[1];
		char	padding[7];
	};
	const struct extended *ext;

	if (gnu_sparse_old_parse(a, tar, header->sparse, 4) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	if (header->isextended[0] == 0)
		return (ARCHIVE_OK);

	do {
		tar_flush_unconsumed(a, unconsumed);
		data = __archive_read_ahead(a, 512, &bytes_read);
		if (bytes_read < 0)
			return (ARCHIVE_FATAL);
		if (bytes_read < 512) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated tar archive "
			    "detected while reading sparse file data");
			return (ARCHIVE_FATAL);
		}
		*unconsumed = 512;
		ext = (const struct extended *)data;
		if (gnu_sparse_old_parse(a, tar, ext->sparse, 21) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	} while (ext->isextended[0] != 0);
	if (tar->sparse_list != NULL)
		tar->entry_offset = tar->sparse_list->offset;
	return (ARCHIVE_OK);
}